

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimpleBroadphase.cpp
# Opt level: O3

void __thiscall
cbtSimpleBroadphase::aabbTest
          (cbtSimpleBroadphase *this,cbtVector3 *aabbMin,cbtVector3 *aabbMax,
          cbtBroadphaseAabbCallback *callback)

{
  cbtSimpleBroadphaseProxy *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar4 = this->m_LastHandleIndex;
  if (-1 < iVar4) {
    lVar6 = -1;
    lVar5 = 0;
    do {
      pcVar1 = this->m_pHandles;
      if (*(long *)((long)(pcVar1->super_cbtBroadphaseProxy).m_aabbMin.m_floats + lVar5 + -0x14) !=
          0) {
        bVar3 = true;
        if ((aabbMin->m_floats[0] <=
             *(float *)((long)(pcVar1->super_cbtBroadphaseProxy).m_aabbMax.m_floats + lVar5)) &&
           (bVar3 = true,
           *(float *)((long)(pcVar1->super_cbtBroadphaseProxy).m_aabbMin.m_floats + lVar5) <=
           aabbMax->m_floats[0])) {
          bVar3 = false;
        }
        bVar2 = true;
        if ((aabbMin->m_floats[2] <=
             *(float *)((long)(pcVar1->super_cbtBroadphaseProxy).m_aabbMax.m_floats + lVar5 + 8)) &&
           (*(float *)((long)(pcVar1->super_cbtBroadphaseProxy).m_aabbMin.m_floats + lVar5 + 8) <=
            aabbMax->m_floats[2])) {
          bVar2 = bVar3;
        }
        if ((aabbMin->m_floats[1] <=
             *(float *)((long)(pcVar1->super_cbtBroadphaseProxy).m_aabbMax.m_floats + lVar5 + 4)) &&
           (!bVar2 && *(float *)((long)(pcVar1->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
                                lVar5 + 4) <= aabbMax->m_floats[1])) {
          (*callback->_vptr_cbtBroadphaseAabbCallback[2])
                    (callback,(long)(pcVar1->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
                              lVar5 + -0x14);
          iVar4 = this->m_LastHandleIndex;
        }
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x38;
    } while (lVar6 < iVar4);
  }
  return;
}

Assistant:

void cbtSimpleBroadphase::aabbTest(const cbtVector3& aabbMin, const cbtVector3& aabbMax, cbtBroadphaseAabbCallback& callback)
{
	for (int i = 0; i <= m_LastHandleIndex; i++)
	{
		cbtSimpleBroadphaseProxy* proxy = &m_pHandles[i];
		if (!proxy->m_clientObject)
		{
			continue;
		}
		if (TestAabbAgainstAabb2(aabbMin, aabbMax, proxy->m_aabbMin, proxy->m_aabbMax))
		{
			callback.process(proxy);
		}
	}
}